

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int vm_builtin_getopt(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  char cVar1;
  jx9_vm *pjVar2;
  jx9_value *pArray;
  jx9_value *pValue;
  ushort **ppuVar3;
  char *pcVar4;
  char *zArg;
  int need_val;
  char *pcVar5;
  ulong uVar6;
  char *zArgEnd;
  char *pcVar7;
  int c;
  jx9_value *local_78;
  jx9_value **local_70;
  char *local_68;
  int nByte;
  getopt_long_opt sLong;
  
  if ((nArg < 1) || (((*apArg)->iFlags & 1) == 0)) {
    pcVar4 = "Missing/Invalid option arguments";
  }
  else {
    pcVar4 = jx9_value_to_string(*apArg,&nByte);
    pjVar2 = pCtx->pVm;
    pValue = jx9_context_new_array(pCtx);
    local_78 = jx9_context_new_scalar(pCtx);
    if (local_78 != (jx9_value *)0x0 && pValue != (jx9_value *)0x0) {
      uVar6 = (ulong)(pjVar2->sArgv).nByte;
      local_70 = apArg;
      if (uVar6 != 0) {
        pcVar5 = pcVar4 + nByte;
        sLong.zArgIn = (char *)(pjVar2->sArgv).pBlob;
        zArgEnd = sLong.zArgIn + uVar6;
        local_68 = sLong.zArgIn + 1;
        sLong.zArgEnd = zArgEnd;
        sLong.pWorker = local_78;
        sLong.pArray = pValue;
        sLong.pCtx = pCtx;
LAB_00127c4f:
        pcVar7 = pcVar4;
        if (pcVar7 < pcVar5) {
          cVar1 = *pcVar7;
          c = (int)cVar1;
          pcVar4 = pcVar7 + 1;
          ppuVar3 = __ctype_b_loc();
          if (((*ppuVar3)[cVar1] & 8) != 0) {
            need_val = 0;
            zArg = local_68;
            if ((pcVar4 < pcVar5) && (*pcVar4 == ':')) {
              pcVar4 = pcVar7 + 2;
              if ((pcVar4 < pcVar5) && (pcVar7[2] == ':')) {
                pcVar4 = pcVar7 + 3;
              }
              need_val = 1;
            }
            for (; zArg + -1 < zArgEnd; zArg = zArg + 1) {
              if (((zArg[-1] == '-') && (zArg < zArgEnd)) && (*zArg == cVar1)) {
                VmExtractOptArgValue(pValue,local_78,zArg,zArgEnd,need_val,pCtx,(char *)&c);
                break;
              }
            }
          }
          goto LAB_00127c4f;
        }
        if (((nArg != 1) && (pArray = local_70[1], (pArray->iFlags & 0x40) != 0)) &&
           (*(int *)((pArray->x).iVal + 0x2c) != 0)) {
          jx9_array_walk(pArray,VmProcessLongOpt,&sLong);
        }
      }
      jx9_result_value(pCtx,pValue);
      return 0;
    }
    pcVar4 = "JX9 is running out of memory";
  }
  jx9_context_throw_error(pCtx,1,pcVar4);
  jx9_result_bool(pCtx,0);
  return 0;
}

Assistant:

static int vm_builtin_getopt(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zIn, *zEnd, *zArg, *zArgIn, *zArgEnd;
	struct getopt_long_opt sLong;
	jx9_value *pArray, *pWorker;
	SyBlob *pArg;
	int nByte;
	if( nArg < 1 || !jx9_value_is_string(apArg[0]) ){
		/* Missing/Invalid arguments, return FALSE */
		jx9_context_throw_error(pCtx, JX9_CTX_ERR, "Missing/Invalid option arguments");
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Extract option arguments */
	zIn  = jx9_value_to_string(apArg[0], &nByte);
	zEnd = &zIn[nByte];
	/* Point to the string representation of the $argv[] array */
	pArg = &pCtx->pVm->sArgv;
	/* Create a new empty array and a worker variable */
	pArray = jx9_context_new_array(pCtx);
	pWorker = jx9_context_new_scalar(pCtx);
	if( pArray == 0 || pWorker == 0 ){
		jx9_context_throw_error(pCtx,JX9_CTX_ERR, "JX9 is running out of memory");
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	if( SyBlobLength(pArg) < 1 ){
		/* Empty command line, return the empty array*/
		jx9_result_value(pCtx, pArray);
		/* Everything will be released automatically when we return 
		 * from this function.
		 */
		return JX9_OK;
	}
	zArgIn = (const char *)SyBlobData(pArg);
	zArgEnd = &zArgIn[SyBlobLength(pArg)];
	/* Fill the long option structure */
	sLong.pArray = pArray;
	sLong.pWorker = pWorker;
	sLong.zArgIn =  zArgIn;
	sLong.zArgEnd = zArgEnd;
	sLong.pCtx = pCtx;
	/* Start processing */
	while( zIn < zEnd ){
		int c = zIn[0];
		int need_val = 0;
		/* Advance the stream cursor */
		zIn++;
		/* Ignore non-alphanum characters */
		if( !SyisAlphaNum(c) ){
			continue;
		}
		if( zIn < zEnd && zIn[0] == ':' ){
			zIn++;
			need_val = 1;
			if( zIn < zEnd && zIn[0] == ':' ){
				zIn++;
			}
		}
		/* Find option */
		zArg = VmFindShortOpt(c, zArgIn, zArgEnd);
		if( zArg == 0 ){
			/* No such option */
			continue;
		}
		/* Extract option argument value */
		VmExtractOptArgValue(pArray, pWorker, zArg, zArgEnd, need_val, pCtx, (const char *)&c);	
	}
	if( nArg > 1 && jx9_value_is_json_array(apArg[1]) && jx9_array_count(apArg[1]) > 0 ){
		/* Process long options */
		jx9_array_walk(apArg[1], VmProcessLongOpt, &sLong);
	}
	/* Return the option array */
	jx9_result_value(pCtx, pArray);
	/* 
	 * Don't worry about freeing memory, everything will be released
	 * automatically as soon we return from this foreign function.
	 */
	return JX9_OK;
}